

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token)

{
  ValueHolder VVar1;
  char cVar2;
  ushort uVar3;
  ValueHolder *pVVar4;
  Reader *pRVar5;
  long *plVar6;
  undefined8 *puVar7;
  _Elt_pointer ppVVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  byte bVar11;
  ushort uVar12;
  long lVar13;
  byte *pbVar14;
  ValueHolder local_98;
  long local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58 [2];
  long local_48 [2];
  Reader *local_38;
  
  cVar2 = *token->start_;
  pbVar14 = (byte *)(token->start_ + (cVar2 == '-'));
  if (pbVar14 == (byte *)token->end_) {
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>();
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x288036);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_68 = *plVar9;
      lStack_60 = plVar6[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar9;
      local_78 = (long *)*plVar6;
    }
    local_70 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar10) {
      local_88._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_88._8_8_ = plVar6[3];
      local_98.string_ = (char *)&local_88;
    }
    else {
      local_88._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_98.string_ = (char *)*plVar6;
    }
    local_90 = plVar6[1];
    *plVar6 = (long)paVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    addError(this,(string *)&local_98,token,(Location)0x0);
    if (local_98 != &local_88) {
      operator_delete(local_98.string_,local_88._M_allocated_capacity + 1);
    }
    if (local_78 != &local_68) {
LAB_001c6b6c:
      operator_delete(local_78,local_68 + 1);
    }
LAB_001c6b79:
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
  }
  else {
    lVar13 = 0;
    local_38 = this;
    do {
      pRVar5 = local_38;
      if ((token->end_ <= pbVar14) || (0xffffffff < lVar13)) {
        if (pbVar14 == (byte *)token->end_) {
          if (cVar2 == '-') {
            if (0xfffffffeffffffff < lVar13 - 0x80000001U) {
              local_98.int_ = -(int)lVar13;
              ppVVar8 = (local_38->nodes_).c.
                        super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur;
              if (ppVVar8 ==
                  (local_38->nodes_).c.
                  super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
                ppVVar8 = (local_38->nodes_).c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              pVVar4 = &ppVVar8[-1]->value_;
              VVar1 = *pVVar4;
              *pVVar4 = local_98;
              uVar3 = *(ushort *)(pVVar4 + 1);
              uVar12 = (uVar3 & 0xff00) + 1;
              *(ushort *)(pVVar4 + 1) = uVar12;
              *(ushort *)(pVVar4 + 1) = uVar12 & 0xfe01 | (ushort)local_90 & 0x100;
              local_90 = CONCAT62((int6)((ulong)local_90 >> 0x10),
                                  (ushort)local_90 & 0xfe00 | uVar3 & 0xff | uVar3 & 0x100);
              local_98 = VVar1;
LAB_001c6e26:
              Value::~Value((Value *)&local_98);
              return true;
            }
            local_58[0] = local_48;
            std::__cxx11::string::_M_construct<char_const*>();
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x288036);
            local_78 = &local_68;
            plVar6 = puVar7 + 2;
            if ((long *)*puVar7 == plVar6) {
              local_68 = *plVar6;
              lStack_60 = puVar7[3];
            }
            else {
              local_68 = *plVar6;
              local_78 = (long *)*puVar7;
            }
            local_70 = puVar7[1];
            *puVar7 = plVar6;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
            local_98.string_ = (char *)&local_88;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 == paVar10) {
              local_88._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_88._8_8_ = plVar6[3];
            }
            else {
              local_88._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_98.string_ = (char *)*plVar6;
            }
            local_90 = plVar6[1];
            *plVar6 = (long)paVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            addError(pRVar5,(string *)&local_98,token,(Location)0x0);
          }
          else {
            if (lVar13 < 0x100000000) {
              if (lVar13 < 0x80000000) {
                local_90 = CONCAT71(local_90._1_7_,1);
              }
              else {
                local_90 = CONCAT71(local_90._1_7_,2);
              }
              local_98.int_ = (int)lVar13;
              ppVVar8 = (local_38->nodes_).c.
                        super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur;
              if (ppVVar8 ==
                  (local_38->nodes_).c.
                  super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
                ppVVar8 = (local_38->nodes_).c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              Value::swap(ppVVar8[-1],(Value *)&local_98);
              goto LAB_001c6e26;
            }
            local_58[0] = local_48;
            std::__cxx11::string::_M_construct<char_const*>();
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x288036);
            local_78 = &local_68;
            plVar6 = puVar7 + 2;
            if ((long *)*puVar7 == plVar6) {
              local_68 = *plVar6;
              lStack_60 = puVar7[3];
            }
            else {
              local_68 = *plVar6;
              local_78 = (long *)*puVar7;
            }
            local_70 = puVar7[1];
            *puVar7 = plVar6;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
            local_98.string_ = (char *)&local_88;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 == paVar10) {
              local_88._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_88._8_8_ = plVar6[3];
            }
            else {
              local_88._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_98.string_ = (char *)*plVar6;
            }
            local_90 = plVar6[1];
            *plVar6 = (long)paVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            addError(pRVar5,(string *)&local_98,token,(Location)0x0);
          }
        }
        else {
          local_58[0] = local_48;
          std::__cxx11::string::_M_construct<char_const*>();
          pRVar5 = local_38;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x288036);
          local_78 = &local_68;
          plVar6 = puVar7 + 2;
          if ((long *)*puVar7 == plVar6) {
            local_68 = *plVar6;
            lStack_60 = puVar7[3];
          }
          else {
            local_68 = *plVar6;
            local_78 = (long *)*puVar7;
          }
          local_70 = puVar7[1];
          *puVar7 = plVar6;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
          local_98.string_ = (char *)&local_88;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar10) {
            local_88._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_88._8_8_ = plVar6[3];
          }
          else {
            local_88._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_98.string_ = (char *)*plVar6;
          }
          local_90 = plVar6[1];
          *plVar6 = (long)paVar10;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          addError(pRVar5,(string *)&local_98,token,(Location)0x0);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98.string_,local_88._M_allocated_capacity + 1);
        }
        if (local_78 != &local_68) goto LAB_001c6b6c;
        goto LAB_001c6b79;
      }
      bVar11 = *pbVar14 - 0x30;
      if (bVar11 < 10) {
        lVar13 = (ulong)(*pbVar14 & 0xf) + lVar13 * 10;
      }
      else {
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x288036);
        local_78 = &local_68;
        plVar9 = plVar6 + 2;
        if ((long *)*plVar6 == plVar9) {
          local_68 = *plVar9;
          lStack_60 = plVar6[3];
        }
        else {
          local_68 = *plVar9;
          local_78 = (long *)*plVar6;
        }
        local_70 = plVar6[1];
        *plVar6 = (long)plVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_98.string_ = (char *)&local_88;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 == paVar10) {
          local_88._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_88._8_8_ = plVar6[3];
        }
        else {
          local_88._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_98.string_ = (char *)*plVar6;
        }
        local_90 = plVar6[1];
        *plVar6 = (long)paVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        addError(local_38,(string *)&local_98,token,(Location)0x0);
        if (local_98 != &local_88) {
          operator_delete(local_98.string_,local_88._M_allocated_capacity + 1);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
      }
      pbVar14 = pbVar14 + 1;
    } while (bVar11 < 10);
  }
  return false;
}

Assistant:

bool
Reader::decodeNumber ( Token& token )
{
    Location current = token.start_;
    bool isNegative = *current == '-';

    if ( isNegative )
        ++current;

    if (current == token.end_)
    {
        return addError ( "'" + std::string ( token.start_, token.end_ ) +
            "' is not a valid number.", token );
    }

    // The existing Json integers are 32-bit so using a 64-bit value here avoids
    // overflows in the conversion code below.
    std::int64_t value = 0;

    static_assert(sizeof(value) > sizeof(Value::maxUInt),
        "The JSON integer overflow logic will need to be reworked.");

    while (current < token.end_ && (value <= Value::maxUInt))
    {
        Char c = *current++;

        if ( c < '0'  ||  c > '9' )
        {
            return addError ( "'" + std::string ( token.start_, token.end_ ) +
                "' is not a number.", token );
        }

        value = (value * 10) + (c - '0');
    }

    // More tokens left -> input is larger than largest possible return value
    if (current != token.end_)
    {
        return addError ( "'" + std::string ( token.start_, token.end_ ) +
            "' exceeds the allowable range.", token );
    }

    if ( isNegative )
    {
        value = -value;

        if (value < Value::minInt || value > Value::maxInt)
        {
            return addError ( "'" + std::string ( token.start_, token.end_ ) +
                "' exceeds the allowable range.", token );
        }

        currentValue () = static_cast<Value::Int>( value );
    }
    else
    {
        if (value > Value::maxUInt)
        {
            return addError ( "'" + std::string ( token.start_, token.end_ ) +
                "' exceeds the allowable range.", token );
        }

        // If it's representable as a signed integer, construct it as one.
        if ( value <= Value::maxInt )
            currentValue () = static_cast<Value::Int>( value );
        else
            currentValue () = static_cast<Value::UInt>( value );
    }

    return true;
}